

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

Bool WantIndent(TidyDocImpl *doc)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int wrap;
  
  if ((doc->pprint).indent[0].spaces < 1) {
    return no;
  }
  uVar1 = (doc->pprint).wraphere;
  iVar2 = (doc->pprint).indent[0].attrValStart;
  if (iVar2 == 0) {
    bVar3 = false;
  }
  else {
    if (iVar2 < 1) goto LAB_0014bdd6;
    bVar3 = (int)uVar1 <= iVar2;
  }
  if ((!bVar3) && (*(int *)((doc->config).value + 0x23) == 0)) {
    return no;
  }
LAB_0014bdd6:
  iVar2 = (doc->pprint).indent[0].attrStringStart;
  if (iVar2 == 0) {
    return no;
  }
  if (iVar2 < 1) {
    return yes;
  }
  return (Bool)((int)uVar1 <= iVar2);
}

Assistant:

static Bool WantIndent( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wantIt = GetSpaces(pprint) > 0;
    if ( wantIt )
    {
        Bool indentAttrs = cfgBool( doc, TidyIndentAttributes );
        wantIt = ( ( !IsWrapInAttrVal(pprint) || indentAttrs ) &&
                   !IsWrapInString(pprint) );
    }
    return wantIt;
}